

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall discordpp::ThreadMember::~ThreadMember(ThreadMember *this)

{
  ThreadMember *this_local;
  
  omittable_field<discordpp::GuildMember>::~omittable_field(&this->member);
  field<int>::~field(&this->flags);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
            (&this->join_timestamp);
  omittable_field<discordpp::Snowflake>::~omittable_field(&this->user_id);
  omittable_field<discordpp::Snowflake>::~omittable_field(&this->id);
  return;
}

Assistant:

ThreadMember(
        omittable_field<Snowflake> id = omitted,
        omittable_field<Snowflake> user_id = omitted,
        field<Timestamp> join_timestamp = uninitialized,
        field<int> flags = uninitialized,
        omittable_field<GuildMember> member = omitted
    ):
        id(id),
        user_id(user_id),
        join_timestamp(join_timestamp),
        flags(flags),
        member(member)
    {}